

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_primitive_box
          (TrimeshPrimitiveManager *this,int prim_index,cbtAABB *primbox)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  float *pfVar8;
  undefined4 in_register_00000034;
  float fVar9;
  cbtPrimitiveTriangle triangle;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_48;
  float local_44;
  float local_40 [2];
  uint local_38;
  float local_34;
  float afStack_30 [6];
  float local_18;
  
  local_18 = 0.01;
  (*(this->super_cbtPrimitiveManagerBase)._vptr_cbtPrimitiveManagerBase[5])
            (this,CONCAT44(in_register_00000034,prim_index),&local_58);
  auVar2 = vminss_avx(ZEXT416(local_38),ZEXT416(local_48));
  auVar3 = vminss_avx(auVar2,ZEXT416(local_58));
  (primbox->m_min).m_floats[0] = auVar3._0_4_;
  auVar2 = vminss_avx(ZEXT416((uint)local_34),ZEXT416((uint)local_44));
  auVar4 = vminss_avx(auVar2,ZEXT416(local_54));
  (primbox->m_min).m_floats[1] = auVar4._0_4_;
  auVar2 = vminss_avx(ZEXT416((uint)afStack_30[0]),ZEXT416((uint)local_40[0]));
  auVar5 = vminss_avx(auVar2,ZEXT416(local_50));
  (primbox->m_min).m_floats[2] = auVar5._0_4_;
  auVar2 = vmaxss_avx(ZEXT416(local_38),ZEXT416(local_48));
  auVar2 = vmaxss_avx(auVar2,ZEXT416(local_58));
  (primbox->m_max).m_floats[0] = auVar2._0_4_;
  pfVar8 = &local_44;
  if (local_44 < local_34) {
    pfVar8 = &local_34;
  }
  auVar1 = vmaxss_avx(ZEXT416((uint)local_34),ZEXT416((uint)local_44));
  uVar6 = vcmpss_avx512f(ZEXT416(local_54),ZEXT416((uint)*pfVar8),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  fVar9 = (float)((uint)bVar7 * auVar1._0_4_ + !bVar7 * local_54);
  (primbox->m_max).m_floats[1] = fVar9;
  pfVar8 = local_40;
  if (local_40[0] < afStack_30[0]) {
    pfVar8 = afStack_30;
  }
  auVar1 = vmaxss_avx(ZEXT416((uint)afStack_30[0]),ZEXT416((uint)local_40[0]));
  uVar6 = vcmpss_avx512f(ZEXT416(local_50),ZEXT416((uint)*pfVar8),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  (primbox->m_min).m_floats[0] = auVar3._0_4_ - local_18;
  (primbox->m_min).m_floats[1] = auVar4._0_4_ - local_18;
  (primbox->m_min).m_floats[2] = auVar5._0_4_ - local_18;
  (primbox->m_max).m_floats[0] = local_18 + auVar2._0_4_;
  (primbox->m_max).m_floats[1] = local_18 + fVar9;
  (primbox->m_max).m_floats[2] = (float)((uint)bVar7 * auVar1._0_4_ + !bVar7 * local_50) + local_18;
  return;
}

Assistant:

virtual void get_primitive_box(int prim_index, cbtAABB& primbox) const
		{
			cbtPrimitiveTriangle triangle;
			get_primitive_triangle(prim_index, triangle);
			primbox.calc_from_triangle_margin(
				triangle.m_vertices[0],
				triangle.m_vertices[1], triangle.m_vertices[2], triangle.m_margin);
		}